

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# notch_pre.hpp
# Opt level: O1

Dataset * __thiscall
notch::pre::SquareAugmented::unapply
          (Dataset *__return_storage_ptr__,SquareAugmented *this,Dataset *dataIn)

{
  pointer pvVar1;
  pointer pvVar2;
  Dataset dOut;
  Array a;
  vector<std::valarray<float>,_std::allocator<std::valarray<float>_>_> local_78;
  size_t local_58;
  void *local_50;
  Dataset *local_48;
  valarray<float> local_40;
  
  local_78.super__Vector_base<std::valarray<float>,_std::allocator<std::valarray<float>_>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_78.super__Vector_base<std::valarray<float>,_std::allocator<std::valarray<float>_>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_78.super__Vector_base<std::valarray<float>,_std::allocator<std::valarray<float>_>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  core::std::vector<std::valarray<float>,_std::allocator<std::valarray<float>_>_>::reserve
            (&local_78,
             (long)(dataIn->
                   super__Vector_base<std::valarray<float>,_std::allocator<std::valarray<float>_>_>)
                   ._M_impl.super__Vector_impl_data._M_finish -
             (long)(dataIn->
                   super__Vector_base<std::valarray<float>,_std::allocator<std::valarray<float>_>_>)
                   ._M_impl.super__Vector_impl_data._M_start >> 4);
  pvVar2 = (dataIn->super__Vector_base<std::valarray<float>,_std::allocator<std::valarray<float>_>_>
           )._M_impl.super__Vector_impl_data._M_start;
  pvVar1 = (dataIn->super__Vector_base<std::valarray<float>,_std::allocator<std::valarray<float>_>_>
           )._M_impl.super__Vector_impl_data._M_finish;
  if (pvVar2 == pvVar1) {
    core::std::vector<std::valarray<float>,_std::allocator<std::valarray<float>_>_>::vector
              (__return_storage_ptr__,dataIn);
  }
  else {
    local_48 = __return_storage_ptr__;
    do {
      local_58 = pvVar2->_M_size;
      local_50 = operator_new(pvVar2->_M_size << 2);
      if (pvVar2->_M_data != (float *)0x0) {
        memcpy(local_50,pvVar2->_M_data,local_58 << 2);
      }
      (*(this->super_ADatasetTransformer)._vptr_ADatasetTransformer[3])(&local_40,this,&local_58);
      std::vector<std::valarray<float>,std::allocator<std::valarray<float>>>::
      emplace_back<std::valarray<float>>
                ((vector<std::valarray<float>,std::allocator<std::valarray<float>>> *)&local_78,
                 &local_40);
      operator_delete(local_40._M_data);
      operator_delete(local_50);
      pvVar2 = pvVar2 + 1;
    } while (pvVar2 != pvVar1);
    (local_48->super__Vector_base<std::valarray<float>,_std::allocator<std::valarray<float>_>_>).
    _M_impl.super__Vector_impl_data._M_start =
         local_78.super__Vector_base<std::valarray<float>,_std::allocator<std::valarray<float>_>_>.
         _M_impl.super__Vector_impl_data._M_start;
    (local_48->super__Vector_base<std::valarray<float>,_std::allocator<std::valarray<float>_>_>).
    _M_impl.super__Vector_impl_data._M_finish =
         local_78.super__Vector_base<std::valarray<float>,_std::allocator<std::valarray<float>_>_>.
         _M_impl.super__Vector_impl_data._M_finish;
    (local_48->super__Vector_base<std::valarray<float>,_std::allocator<std::valarray<float>_>_>).
    _M_impl.super__Vector_impl_data._M_end_of_storage =
         local_78.super__Vector_base<std::valarray<float>,_std::allocator<std::valarray<float>_>_>.
         _M_impl.super__Vector_impl_data._M_end_of_storage;
    local_78.super__Vector_base<std::valarray<float>,_std::allocator<std::valarray<float>_>_>.
    _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    local_78.super__Vector_base<std::valarray<float>,_std::allocator<std::valarray<float>_>_>.
    _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    local_78.super__Vector_base<std::valarray<float>,_std::allocator<std::valarray<float>_>_>.
    _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    __return_storage_ptr__ = local_48;
  }
  core::std::vector<std::valarray<float>,_std::allocator<std::valarray<float>_>_>::~vector
            (&local_78);
  return __return_storage_ptr__;
}

Assistant:

virtual Dataset unapply(const Dataset &dataIn) {
        Dataset dOut;
        dOut.reserve(dataIn.size());
        if (dataIn.empty()) {
            return dataIn;
        }
        for (Array a : dataIn) {
            dOut.push_back(unapply(a));
        }
        return dOut;
    }